

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

container_t *
container_lazy_ixor(container_t *c1,uint8_t type1,container_t *c2,uint8_t type2,uint8_t *result_type
                   )

{
  int iVar1;
  container_t *pcVar2;
  byte in_CL;
  container_t *in_RDX;
  byte in_SIL;
  bitset_container_t *in_RDI;
  bitset_container_t *in_R8;
  bitset_container_t *bc;
  bitset_container_t *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe8;
  bitset_container_t *pbVar3;
  container_t *in_stack_fffffffffffffff8;
  uint8_t type2_00;
  
  pcVar2 = container_unwrap_shared(in_RDX,&stack0xffffffffffffffdf);
  type2_00 = (uint8_t)((ulong)pcVar2 >> 0x38);
  if ((uint)in_CL + (uint)in_SIL * 4 == 5) {
    bitset_container_xor_nocard
              ((bitset_container_t *)CONCAT17(in_CL,in_stack_ffffffffffffffd8),in_R8,
               in_stack_ffffffffffffffc8);
    *(undefined1 *)&in_R8->cardinality = 1;
  }
  else {
    pbVar3 = in_RDI;
    if ((in_SIL == 1) && (in_RDI->cardinality == -1)) {
      iVar1 = bitset_container_compute_cardinality(in_RDI);
      in_RDI->cardinality = iVar1;
    }
    in_RDI = (bitset_container_t *)
             container_ixor(in_stack_fffffffffffffff8,(uint8_t)((ulong)pbVar3 >> 0x38),
                            (container_t *)CONCAT17(in_SIL,in_stack_ffffffffffffffe8),type2_00,
                            (uint8_t *)CONCAT17(in_CL,in_stack_ffffffffffffffd8));
  }
  return in_RDI;
}

Assistant:

static inline container_t *container_lazy_ixor(container_t *c1, uint8_t type1,
                                               const container_t *c2,
                                               uint8_t type2,
                                               uint8_t *result_type) {
    assert(type1 != SHARED_CONTAINER_TYPE);
    // c1 = get_writable_copy_if_shared(c1,&type1);
    c2 = container_unwrap_shared(c2, &type2);
    switch (PAIR_CONTAINER_TYPES(type1, type2)) {
        case CONTAINER_PAIR(BITSET, BITSET):
            bitset_container_xor_nocard(CAST_bitset(c1), const_CAST_bitset(c2),
                                        CAST_bitset(c1));  // is lazy
            *result_type = BITSET_CONTAINER_TYPE;
            return c1;

        // TODO: other cases being lazy, esp. when we know inplace not likely
        // could see the corresponding code for union
        default:
            // we may have a dirty bitset (without a precomputed cardinality)
            // and calling container_ixor on it might be unsafe.
            if (type1 == BITSET_CONTAINER_TYPE) {
                bitset_container_t *bc = CAST_bitset(c1);
                if (bc->cardinality == BITSET_UNKNOWN_CARDINALITY) {
                    bc->cardinality = bitset_container_compute_cardinality(bc);
                }
            }
            return container_ixor(c1, type1, c2, type2, result_type);
    }
}